

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int fetch_label(char *dest,char *src,char *base,char **next)

{
  ushort uVar1;
  short sVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  ushort *puVar6;
  short sVar7;
  long lVar8;
  
  do {
    bVar3 = (byte)*(ushort *)src;
    if (bVar3 == 0) {
      iVar4 = -1;
LAB_0010377c:
      dest[iVar4] = '\0';
      if (next != (char **)0x0) {
        *next = src;
      }
      return iVar4;
    }
    lVar8 = 0;
    iVar4 = 0;
    sVar7 = 0;
    puVar6 = (ushort *)src;
    while (bVar3 < 0x40) {
      if ('\0' < (char)*puVar6) {
        lVar5 = 0;
        do {
          dest[(short)((short)iVar4 + (short)lVar5)] = *(char *)((long)src + lVar5 + lVar8 + 1);
          lVar5 = lVar5 + 1;
        } while (lVar5 < (char)*puVar6);
        iVar4 = (int)lVar5 + iVar4;
      }
      sVar2 = (short)iVar4;
      iVar4 = iVar4 + 1;
      dest[sVar2] = '.';
      sVar7 = sVar7 + 1 + (short)(char)*puVar6;
      lVar8 = (long)sVar7;
      puVar6 = (ushort *)((long)src + lVar8);
      bVar3 = *(byte *)((long)src + lVar8);
      if (bVar3 == 0) {
        iVar4 = (short)iVar4 + -1;
        src = (char *)puVar6;
        goto LAB_0010377c;
      }
    }
    uVar1 = *puVar6;
    if (next != (char **)0x0) {
      *next = (char *)(puVar6 + 1);
    }
    dest = dest + (short)iVar4;
    src = base + (ushort)((uVar1 & 0xff3f) << 8 | uVar1 >> 8);
    next = (char **)0x0;
  } while( true );
}

Assistant:

int fetch_label(char *dest, char *src, char *base, char **next) {
  /*
  获取标签。

  dest: 要复制到的字符串
  src:  压缩字符串开始的位置
  base: DNS报文头
  next:串结束的位置，不需要的话可以传入一个NULL
  返回值：
  -1： 异常
  其他正数： 读取的字符串长度

  压缩方案使得标签有如下三种可能：
  * 以'\0'结束
  * 以指针结束
  * 指针（只有一个指针）
  并且，一个标签最多只有一个指针。

  下面的解决方案是：
  * 如果头是指针，直接整个复制下来。
  * 否则，按正常的读取，直到遇到指针或者0.
  * 遇到0，则终止；否则整个复制下来，结束。
  */
  short now = 0;
  short i = 0;
  
  while (src[now] != 0) {
    // printf("%d ",now);fflush(stdout);
    if (is_compress(src[now])) {
      unsigned short pos =
          get_compress_pos(ntohs(*(const unsigned short *)(src + now)));
      // printf("pos=%d ",pos);fflush(stdout);
      if (next)
        *next = src + now + 2;
      return fetch_label(dest + i, base + pos, base, NULL);
    } else {
      // printf(" bbb ");fflush(stdout);
      for (short j = 1; j <= src[now]; j++){
        dest[i++] = src[j + now];
      }
      dest[i++] = '.';
      now += src[now] + 1;
    }
  }
  dest[i - 1] = '\0';
  if (next)
    *next = src + now;
  // printf("\n");fflush(stdout);
  return i - 1;
}